

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::Model(Model *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  (this->score_func_)._M_dataplus._M_p = (pointer)&(this->score_func_).field_2;
  (this->score_func_)._M_string_length = 0;
  (this->score_func_).field_2._M_local_buf[0] = '\0';
  (this->loss_func_)._M_dataplus._M_p = (pointer)&(this->loss_func_).field_2;
  (this->loss_func_)._M_string_length = 0;
  (this->loss_func_).field_2._M_local_buf[0] = '\0';
  this->param_w_ = (real_t *)0x0;
  this->param_v_ = (real_t *)0x0;
  this->param_b_ = (real_t *)0x0;
  this->param_best_w_ = (real_t *)0x0;
  this->param_b_ = (real_t *)0x0;
  this->param_best_w_ = (real_t *)0x0;
  this->param_best_v_ = (real_t *)0x0;
  this->param_best_b_ = (real_t *)0x0;
  if (filename->_M_string_length == 0) {
    local_54.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_30,"Model",&local_56);
    poVar2 = Logger::Start(ERR,&local_50,0xca,&local_30);
    poVar2 = std::operator<<(poVar2,"CHECK_NE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xca);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"filename.empty()");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    Logger::~Logger(&local_54);
    abort();
  }
  bVar1 = Deserialize(this,filename);
  if (bVar1) {
    return;
  }
  StringPrintf_abi_cxx11_
            (&local_50,"Cannot Load model from the file: %s",(filename->_M_dataplus)._M_p);
  Color::print_error(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  exit(0);
}

Assistant:

Model::Model(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  if (this->Deserialize(filename) == false) {
    Color::print_error(
      StringPrintf("Cannot Load model from the file: %s",
           filename.c_str())
    );
    exit(0);
  }
}